

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O2

TPZGeoEl * TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *Mesh,int64_t ElemIndex)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  TPZGeoEl **ppTVar5;
  undefined4 extraout_var;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int s;
  ulong uVar11;
  int64_t oldId;
  TPZGeoElSide neigh;
  TPZVec<TPZGeoElSide> oldNeigh;
  TPZManVector<long,_10> nodeindexes;
  TPZGeoEl *pTVar6;
  
  ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(Mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,ElemIndex);
  pTVar6 = *ppTVar5;
  if (pTVar6 == (TPZGeoEl *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar7 = std::operator<<(poVar7,
                             "static TPZGeoEl *TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *, int64_t)"
                            );
    std::operator<<(poVar7," - NULL geometric element.\n");
    pTVar6 = (TPZGeoEl *)0x0;
  }
  else {
    uVar2 = (**(code **)(*(long *)pTVar6 + 0xb8))(pTVar6);
    oldId = pTVar6->fId;
    uVar1 = pTVar6->fMatId;
    uVar3 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
    TPZVec<TPZGeoElSide>::TPZVec(&oldNeigh,(long)(int)uVar3);
    uVar11 = 0;
    uVar8 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar8 = uVar11;
    }
    lVar10 = 8;
    for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      nodeindexes.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      nodeindexes.super_TPZVec<long>.fNElements._0_4_ = (undefined4)uVar11;
      nodeindexes.super_TPZVec<long>.fStore = (long *)pTVar6;
      TPZGeoElSide::Neighbour(&neigh,(TPZGeoElSide *)&nodeindexes);
      *(int *)((long)&(oldNeigh.fStore)->fGeoEl + lVar10) = neigh.fSide;
      *(TPZGeoEl **)((long)&((oldNeigh.fStore)->super_TPZSavable)._vptr_TPZSavable + lVar10) =
           neigh.fGeoEl;
      lVar10 = lVar10 + 0x18;
    }
    uVar3 = (**(code **)(*(long *)pTVar6 + 0x98))(pTVar6);
    TPZManVector<long,_10>::TPZManVector(&nodeindexes,(long)(int)uVar3);
    uVar9 = 0;
    uVar11 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar11 = uVar9;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      lVar10 = (**(code **)(*(long *)pTVar6 + 0xa8))(pTVar6,uVar9 & 0xffffffff);
      nodeindexes.super_TPZVec<long>.fStore[uVar9] = lVar10;
    }
    TPZGeoMesh::DeleteElement(Mesh,pTVar6,-1);
    iVar4 = (*(Mesh->super_TPZSavable)._vptr_TPZSavable[0xd])
                      (Mesh,(ulong)uVar2,&nodeindexes,(ulong)uVar1,&oldId);
    pTVar6 = (TPZGeoEl *)CONCAT44(extraout_var,iVar4);
    lVar10 = 8;
    for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      neigh.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      neigh.fSide = *(int *)((long)&(oldNeigh.fStore)->fGeoEl + lVar10);
      neigh.fGeoEl = *(TPZGeoEl **)
                      ((long)&((oldNeigh.fStore)->super_TPZSavable)._vptr_TPZSavable + lVar10);
      (**(code **)(*(long *)pTVar6 + 0x198))(pTVar6,uVar11 & 0xffffffff,&neigh);
      lVar10 = lVar10 + 0x18;
    }
    TPZGeoEl::BuildBlendConnectivity(pTVar6);
    TPZManVector<long,_10>::~TPZManVector(&nodeindexes);
    TPZVec<TPZGeoElSide>::~TPZVec(&oldNeigh);
  }
  return pTVar6;
}

Assistant:

TPZGeoEl * TPZChangeEl::ChangeToGeoBlend(TPZGeoMesh *Mesh, int64_t ElemIndex)
{
	TPZGeoEl * OldElem = Mesh->ElementVec()[ElemIndex];
	if(!OldElem)
    {
		PZError << "Error at " << __PRETTY_FUNCTION__ << " - NULL geometric element.\n";
		return NULL;
	}
    MElementType oldType = OldElem->Type();
    int64_t oldId = OldElem->Id();
    int64_t oldMatId = OldElem->MaterialId();
    int nsides = OldElem->NSides();
    
    TPZVec<TPZGeoElSide> oldNeigh(nsides);
    for(int s = 0; s < nsides; s++)
    {   
        TPZGeoElSide mySide(OldElem, s);
        oldNeigh[s] = mySide.Neighbour();
    }
	
	const int nnodes = OldElem->NCornerNodes();
	TPZManVector<int64_t> nodeindexes(nnodes);
	for(int i = 0; i < nnodes; i++)
    {
        nodeindexes[i] = OldElem->NodeIndex(i);
    }
    
    Mesh->DeleteElement(OldElem);
    
	TPZGeoEl * NewElem = Mesh->CreateGeoBlendElement(oldType, nodeindexes, oldMatId, oldId);

    for(int s = 0; s < nsides; s++)
    {   
        TPZGeoElSide neigh = oldNeigh[s];
        NewElem->SetNeighbour(s, neigh);
    }
    
	NewElem->BuildBlendConnectivity();
	
	return NewElem;
}